

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O3

Object * executeBlock(Object *__return_storage_ptr__,Block b,Environment *env)

{
  Object *in_RAX;
  Object *pOVar1;
  Statement *pSVar2;
  ulong uVar3;
  Object local_68;
  
  pSVar2 = b.statements;
  *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x28) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x30) = 0;
  (__return_storage_ptr__->field_1).routine.arguments = (char **)0;
  *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0;
  (__return_storage_ptr__->field_1).literal.field_2 = (anon_union_8_4_50a03f35_for_Literal_2)0;
  *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0;
  __return_storage_ptr__->type = OBJECT_NULL;
  *(undefined4 *)&__return_storage_ptr__->field_0x4 = 0;
  (__return_storage_ptr__->field_1).instance = (Instance *)0x400000000;
  if (0 < b.numStatements) {
    uVar3 = (ulong)(b.numStatements & 0x7fffffff);
    do {
      uVar3 = uVar3 - 1;
      pOVar1 = executeStatement(&local_68,*pSVar2,env);
      *(Statement **)((long)&__return_storage_ptr__->field_1 + 0x28) =
           local_68.field_1.container.constructor.statements;
      *(Statement **)((long)&__return_storage_ptr__->field_1 + 0x30) =
           local_68.field_1.routine.code.statements;
      (__return_storage_ptr__->field_1).routine.arguments = local_68.field_1.routine.arguments;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = local_68.field_1._32_8_;
      (__return_storage_ptr__->field_1).literal.field_2 = local_68.field_1.literal.field_2;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = local_68.field_1._16_8_;
      __return_storage_ptr__->type = local_68.type;
      *(undefined4 *)&__return_storage_ptr__->field_0x4 = local_68._4_4_;
      (__return_storage_ptr__->field_1).instance = local_68.field_1.instance;
      in_RAX = (Object *)CONCAT71((int7)((ulong)pOVar1 >> 8),uVar3 == 0);
      if (brk != '\0') {
        return in_RAX;
      }
      if ((ret & 1) != 0) {
        return in_RAX;
      }
      pSVar2 = pSVar2 + 1;
    } while (uVar3 != 0);
  }
  return in_RAX;
}

Assistant:

static Object executeBlock(Block b, Environment *env){
    //debug("Executing block statement");
    int num = 0;
    Object retl = nullObject;
    while(num < b.numStatements){
        retl = executeStatement(b.statements[num], env);
        if(brk || ret)
            break;
        num++;
    }
    return retl;
}